

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

void MouseButtonCallback(GLFWwindow *window,int button,int action,int mods)

{
  GestureEvent event;
  int iVar1;
  Vector2 VVar2;
  undefined4 uStack_58;
  undefined4 uStack_54;
  GestureEvent gestureEvent;
  int mods_local;
  int action_local;
  int button_local;
  GLFWwindow *window_local;
  
  CORE.Input.Mouse.currentButtonState[button] = (char)action;
  gestureEvent.position[3].y = (float)mods;
  memset(&uStack_58,0,0x38);
  if ((CORE.Input.Mouse.currentButtonState[button] == '\x01') &&
     (CORE.Input.Mouse.previousButtonState[button] == '\0')) {
    uStack_58 = 1;
  }
  else if ((CORE.Input.Mouse.currentButtonState[button] == '\0') &&
          (CORE.Input.Mouse.previousButtonState[button] == '\x01')) {
    uStack_58 = 0;
  }
  gestureEvent.touchAction = 0;
  uStack_54 = 1;
  VVar2 = GetMousePosition();
  gestureEvent.pointerId._8_8_ = VVar2;
  iVar1 = GetScreenWidth();
  gestureEvent.pointerId[2] = (int)((float)gestureEvent.pointerId[2] / (float)iVar1);
  iVar1 = GetScreenHeight();
  gestureEvent.pointerId[3] = (int)((float)gestureEvent.pointerId[3] / (float)iVar1);
  event.pointCount = gestureEvent.pointCount;
  event.touchAction = gestureEvent.touchAction;
  event.pointerId[0] = gestureEvent.pointerId[0];
  event.pointerId[1] = gestureEvent.pointerId[1];
  event.pointerId[2] = gestureEvent.pointerId[2];
  event.pointerId[3] = gestureEvent.pointerId[3];
  event.position[0] = gestureEvent.position[0];
  event.position[1] = gestureEvent.position[1];
  event.position[2] = gestureEvent.position[2];
  event.position[3] = VVar2;
  ProcessGestureEvent(event);
  return;
}

Assistant:

static void MouseButtonCallback(GLFWwindow *window, int button, int action, int mods)
{
    // WARNING: GLFW could only return GLFW_PRESS (1) or GLFW_RELEASE (0) for now,
    // but future releases may add more actions (i.e. GLFW_REPEAT)
    CORE.Input.Mouse.currentButtonState[button] = action;

#if defined(SUPPORT_GESTURES_SYSTEM) && defined(SUPPORT_MOUSE_GESTURES)
    // Process mouse events as touches to be able to use mouse-gestures
    GestureEvent gestureEvent = { 0 };

    // Register touch actions
    if ((CORE.Input.Mouse.currentButtonState[button] == 1) && (CORE.Input.Mouse.previousButtonState[button] == 0)) gestureEvent.touchAction = TOUCH_DOWN;
    else if ((CORE.Input.Mouse.currentButtonState[button] == 0) && (CORE.Input.Mouse.previousButtonState[button] == 1)) gestureEvent.touchAction = TOUCH_UP;

    // NOTE: TOUCH_MOVE event is registered in MouseCursorPosCallback()

    // Assign a pointer ID
    gestureEvent.pointerId[0] = 0;

    // Register touch points count
    gestureEvent.pointCount = 1;

    // Register touch points position, only one point registered
    gestureEvent.position[0] = GetMousePosition();

    // Normalize gestureEvent.position[0] for CORE.Window.screen.width and CORE.Window.screen.height
    gestureEvent.position[0].x /= (float)GetScreenWidth();
    gestureEvent.position[0].y /= (float)GetScreenHeight();

    // Gesture data is sent to gestures system for processing
    ProcessGestureEvent(gestureEvent);
#endif
}